

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.hpp
# Opt level: O0

SPIRVariable * __thiscall
spirv_cross::Parser::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass&,unsigned_int&>
          (Parser *this,uint32_t id,uint *args,StorageClass *args_1,uint *args_2)

{
  Variant *var_00;
  TypedID<(spirv_cross::Types)0> local_44;
  SPIRVariable *local_40;
  SPIRVariable *var;
  uint *local_30;
  uint *args_local_2;
  StorageClass *args_local_1;
  uint *args_local;
  Parser *pPStack_10;
  uint32_t id_local;
  Parser *this_local;
  
  local_30 = args_2;
  args_local_2 = args_1;
  args_local_1 = args;
  args_local._4_4_ = id;
  pPStack_10 = this;
  TypedID<(spirv_cross::Types)0>::TypedID((TypedID<(spirv_cross::Types)0> *)((long)&var + 4),id);
  ParsedIR::add_typed_id(&this->ir,TypeVariable,var._4_4_);
  var_00 = VectorView<spirv_cross::Variant>::operator[]
                     (&(this->ir).ids.super_VectorView<spirv_cross::Variant>,(ulong)args_local._4_4_
                     );
  local_40 = variant_set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass&,unsigned_int&>
                       (var_00,args_local_1,args_local_2,local_30);
  TypedID<(spirv_cross::Types)0>::TypedID(&local_44,args_local._4_4_);
  (local_40->super_IVariant).self.id = local_44.id;
  return local_40;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		return var;
	}